

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::Contribute_v2
          (TPZDohrSubstruct<std::complex<long_double>_> *this,
          TPZFMatrix<std::complex<long_double>_> *v2)

{
  longdouble lVar1;
  int iVar2;
  pair<int,_int> *ppVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  complex<long_double> *pcVar7;
  ulong uVar8;
  complex<long_double> __r;
  complex<long_double> local_58;
  
  SolveSystemZi(this);
  uVar4 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar4) {
    uVar8 = 0;
    do {
      ppVar3 = (this->fGlobalEqs).fStore;
      lVar5 = (long)ppVar3[uVar8].first;
      iVar2 = ppVar3[uVar8].second;
      lVar6 = (long)iVar2;
      pcVar7 = (this->fWeights).super_TPZVec<std::complex<long_double>_>.fStore + lVar5;
      if (((lVar5 < 0) ||
          ((this->fzi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow <= lVar5
          )) || ((this->fzi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol <
                 1)) {
        TPZFMatrix<std::complex<long_double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_58._M_value._0_8_ = *(undefined8 *)pcVar7->_M_value;
      local_58._M_value._16_8_ = *(undefined8 *)(pcVar7->_M_value + 0x10);
      local_58._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar7->_M_value + 0x18),0);
      local_58._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar7->_M_value + 0x18) >> 0x10,0);
      local_58._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar7->_M_value + 8),0);
      local_58._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar7->_M_value + 8) >> 0x10,0);
      std::complex<long_double>::operator*=(&local_58,(this->fzi).fElem + lVar5);
      if (((iVar2 < 0) ||
          ((v2->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar6)) ||
         ((v2->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<long_double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pcVar7 = v2->fElem;
      lVar1 = *(longdouble *)(pcVar7[lVar6]._M_value + 0x10);
      *(longdouble *)pcVar7[lVar6]._M_value =
           *(longdouble *)pcVar7[lVar6]._M_value +
           (longdouble)CONCAT28(local_58._M_value._8_2_,local_58._M_value._0_8_);
      *(longdouble *)(pcVar7[lVar6]._M_value + 0x10) =
           lVar1 + (longdouble)CONCAT28(local_58._M_value._24_2_,local_58._M_value._16_8_);
      uVar8 = uVar8 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar8);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v2(TPZFMatrix<TVar> &v2) {
	int i;
	SolveSystemZi();
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fzi(fInternalEqs[i],0) = 0.;
	}
#endif
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		v2(ind.second,0) += fWeights[ind.first] * fzi(ind.first,0);
	}
}